

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O2

void pztopology::TPZPrism::ComputeHCurlDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *transformationIds)

{
  long col;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int *piVar5;
  double *pdVar6;
  int x;
  long row;
  long col_00;
  int i;
  long lVar7;
  long col_01;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  TPZManVector<double,_9> edgeSign;
  TPZManVector<double,_3> v3;
  TPZManVector<double,_5> faceOrient;
  TPZManVector<double,_2> vft2;
  TPZManVector<double,_2> vft1;
  TPZTransform<double> local_260;
  TPZFMatrix<double> axes;
  
  TPZManVector<double,_3>::TPZManVector(&v1,3);
  TPZManVector<double,_3>::TPZManVector(&v2,3);
  TPZManVector<double,_3>::TPZManVector(&v3,3);
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    pdVar6 = TPZFMatrix<double>::operator()(gradx,lVar7,0);
    v1.super_TPZVec<double>.fStore[lVar7] = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()(gradx,lVar7,1);
    v2.super_TPZVec<double>.fStore[lVar7] = *pdVar6;
    pdVar6 = TPZFMatrix<double>::operator()(gradx,lVar7,2);
    v3.super_TPZVec<double>.fStore[lVar7] = *pdVar6;
  }
  local_260.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_9>::TPZManVector(&edgeSign,9,(double *)&local_260);
  local_260.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_5>::TPZManVector(&faceOrient,5,(double *)&local_260);
  piVar5 = transformationIds->fStore;
  for (lVar7 = 0; lVar7 != 9; lVar7 = lVar7 + 1) {
    edgeSign.super_TPZVec<double>.fStore[lVar7] = (double)(int)(-(uint)(piVar5[lVar7] != 0) | 1);
  }
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    faceOrient.super_TPZVec<double>.fStore[lVar7] = (double)(int)(-(piVar5[lVar7 + 9] & 1U) | 1);
  }
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = *edgeSign.super_TPZVec<double>.fStore;
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0);
    *pdVar6 = dVar1 * dVar2;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar3 = *edgeSign.super_TPZVec<double>.fStore;
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,1);
    *pdVar6 = (dVar1 + dVar2) * dVar3;
    dVar1 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[1];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,2);
    *pdVar6 = (dVar1 * 1.4142135623730951 * dVar2) / 1.4142135623730951;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[1];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,3);
    *pdVar6 = (dVar1 * -1.4142135623730951 * dVar2) / 1.4142135623730951;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar3 = edgeSign.super_TPZVec<double>.fStore[2];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,4);
    *pdVar6 = dVar3 * -(dVar1 + dVar2);
    dVar1 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[2];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,5);
    *pdVar6 = dVar2 * -dVar1;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[3];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,6);
    *pdVar6 = dVar1 * dVar2 * 0.5;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[3];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,7);
    *pdVar6 = dVar1 * dVar2 * 0.5;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[4];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,8);
    *pdVar6 = dVar1 * dVar2 * 0.5;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[4];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,9);
    *pdVar6 = dVar1 * dVar2 * 0.5;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[5];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,10);
    *pdVar6 = dVar1 * dVar2 * 0.5;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[5];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0xb);
    *pdVar6 = dVar1 * dVar2 * 0.5;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[6];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0xc);
    *pdVar6 = dVar1 * dVar2;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar3 = edgeSign.super_TPZVec<double>.fStore[6];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0xd);
    *pdVar6 = (dVar1 + dVar2) * dVar3;
    dVar1 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0xe);
    *pdVar6 = (dVar1 * 1.4142135623730951 * dVar2) / 1.4142135623730951;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0xf);
    *pdVar6 = (dVar1 * -1.4142135623730951 * dVar2) / 1.4142135623730951;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar3 = edgeSign.super_TPZVec<double>.fStore[8];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x10);
    *pdVar6 = dVar3 * -(dVar1 + dVar2);
    dVar1 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[8];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x11);
    *pdVar6 = dVar2 * -dVar1;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar3 = *edgeSign.super_TPZVec<double>.fStore;
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x12);
    *pdVar6 = (dVar2 * 0.5 + dVar1) * dVar3;
    dVar1 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar2 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar3 = edgeSign.super_TPZVec<double>.fStore[1];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x13);
    *pdVar6 = ((dVar1 - dVar2) * 0.7071067811865476 * dVar3) / 1.4142135623730951;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar3 = edgeSign.super_TPZVec<double>.fStore[2];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x14);
    *pdVar6 = (dVar1 * -0.5 - dVar2) * dVar3;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[3];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x15);
    *pdVar6 = dVar1 * dVar2 * 0.5;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[4];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x16);
    *pdVar6 = dVar1 * dVar2 * 0.5;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[5];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x17);
    *pdVar6 = dVar1 * dVar2 * 0.5;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar3 = edgeSign.super_TPZVec<double>.fStore[6];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x18);
    *pdVar6 = (dVar2 * 0.5 + dVar1) * dVar3;
    dVar1 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar2 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar3 = edgeSign.super_TPZVec<double>.fStore[7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x19);
    *pdVar6 = ((dVar1 - dVar2) * 0.7071067811865476 * dVar3) / 1.4142135623730951;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = v2.super_TPZVec<double>.fStore[lVar7];
    dVar3 = edgeSign.super_TPZVec<double>.fStore[8];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x1a);
    *pdVar6 = (dVar1 * -0.5 - dVar2) * dVar3;
    dVar1 = *faceOrient.super_TPZVec<double>.fStore;
    dVar2 = *edgeSign.super_TPZVec<double>.fStore;
    dVar3 = v2.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x1b);
    dVar3 = dVar1 * dVar2 * dVar3;
    *pdVar6 = dVar3 + dVar3;
    dVar1 = *faceOrient.super_TPZVec<double>.fStore;
    dVar2 = edgeSign.super_TPZVec<double>.fStore[1];
    dVar3 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar4 = v2.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x1c);
    dVar1 = (dVar3 + dVar4) * dVar2 * -dVar1;
    *pdVar6 = dVar1 + dVar1;
    dVar1 = *faceOrient.super_TPZVec<double>.fStore;
    dVar2 = edgeSign.super_TPZVec<double>.fStore[2];
    dVar3 = v1.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x1d);
    dVar3 = dVar1 * dVar2 * dVar3;
    *pdVar6 = dVar3 + dVar3;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[1];
    dVar2 = *edgeSign.super_TPZVec<double>.fStore;
    dVar3 = v3.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x1e);
    *pdVar6 = dVar1 * dVar2 * 0.5 * dVar3 * 0.5;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[1];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[4];
    dVar3 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar4 = v2.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x1f);
    *pdVar6 = (dVar3 + dVar4) * dVar2 * dVar1 * -0.5;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[1];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[6];
    dVar3 = v3.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x20);
    *pdVar6 = dVar1 * dVar2 * 0.5 * dVar3 * 0.5;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[1];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[3];
    dVar3 = v1.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x21);
    *pdVar6 = dVar1 * dVar2 * dVar3 * -0.5;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[2];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[1];
    dVar3 = v3.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x22);
    *pdVar6 = (dVar1 * dVar2 * 0.7071067811865476 * dVar3) / 2.8284271247461903;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[2];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[5];
    dVar3 = v1.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x23);
    *pdVar6 = (dVar1 * dVar2 * 1.4142135623730951 * dVar3) / 2.8284271247461903;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[2];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[7];
    dVar3 = v3.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x24);
    *pdVar6 = (dVar1 * dVar2 * 0.7071067811865476 * dVar3) / 2.8284271247461903;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[2];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[4];
    dVar3 = v2.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x25);
    *pdVar6 = (dVar1 * dVar2 * -1.4142135623730951 * dVar3) / 2.8284271247461903;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[3];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[2];
    dVar3 = v3.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x26);
    *pdVar6 = dVar1 * dVar2 * -0.5 * dVar3 * 0.5;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[3];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[5];
    dVar3 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar4 = v2.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x27);
    *pdVar6 = (dVar3 + dVar4) * dVar2 * dVar1 * -0.5;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[3];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[8];
    dVar3 = v3.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x28);
    *pdVar6 = dVar1 * dVar2 * -0.5 * dVar3 * 0.5;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[3];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[3];
    dVar3 = v2.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x29);
    *pdVar6 = dVar1 * dVar2 * dVar3 * -0.5;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[4];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[6];
    dVar3 = v2.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x2a);
    dVar3 = dVar1 * dVar2 * dVar3;
    *pdVar6 = dVar3 + dVar3;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[4];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[7];
    dVar3 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar4 = v2.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x2b);
    dVar1 = (dVar3 + dVar4) * dVar2 * -dVar1;
    *pdVar6 = dVar1 + dVar1;
    dVar1 = faceOrient.super_TPZVec<double>.fStore[4];
    dVar2 = edgeSign.super_TPZVec<double>.fStore[8];
    dVar3 = v1.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x2c);
    dVar3 = dVar1 * dVar2 * dVar3;
    *pdVar6 = dVar3 + dVar3;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x37);
    *pdVar6 = -dVar1;
    dVar1 = v2.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x38);
    *pdVar6 = -dVar1;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    dVar2 = v2.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x39);
    *pdVar6 = (dVar1 + dVar2) * 0.7071067811865476;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x3a);
    *pdVar6 = -dVar1;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x3b);
    *pdVar6 = dVar1;
    dVar1 = v1.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x3c);
    *pdVar6 = dVar1;
    dVar1 = v2.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x3d);
    *pdVar6 = dVar1;
    dVar1 = v3.super_TPZVec<double>.fStore[lVar7];
    pdVar6 = TPZFMatrix<double>::operator()(directions,lVar7,0x3e);
    *pdVar6 = dVar1;
  }
  local_260.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_2>::TPZManVector(&vft1,2,(double *)&local_260);
  local_260.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_2>::TPZManVector(&vft2,2,(double *)&local_260);
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    if ((int)lVar7 - 1U < 3) {
      TPZQuadrilateral::ComputeHCurlFaceDirections<double>
                (&vft1.super_TPZVec<double>,&vft2.super_TPZVec<double>,
                 transformationIds->fStore[lVar7 + 9]);
    }
    else {
      TPZTriangle::ComputeHCurlFaceDirections<double>
                (&vft1.super_TPZVec<double>,&vft2.super_TPZVec<double>,
                 transformationIds->fStore[lVar7 + 9]);
    }
    col = lVar7 * 2 + 0x2d;
    pdVar6 = TPZFMatrix<double>::operator()(directions,0,col);
    *pdVar6 = 0.0;
    pdVar6 = TPZFMatrix<double>::operator()(directions,1,col);
    *pdVar6 = 0.0;
    pdVar6 = TPZFMatrix<double>::operator()(directions,2,col);
    *pdVar6 = 0.0;
    col_00 = lVar7 * 2 + 0x2e;
    pdVar6 = TPZFMatrix<double>::operator()(directions,0,col_00);
    *pdVar6 = 0.0;
    pdVar6 = TPZFMatrix<double>::operator()(directions,1,col_00);
    *pdVar6 = 0.0;
    pdVar6 = TPZFMatrix<double>::operator()(directions,2,col_00);
    *pdVar6 = 0.0;
    TransformElementToSide(&local_260,(int)lVar7 + 0xf);
    TPZFMatrix<double>::TPZFMatrix(&axes,&local_260.fMult.super_TPZFMatrix<double>);
    TPZTransform<double>::~TPZTransform(&local_260);
    TPZFMatrix<double>::Transpose(&axes);
    for (row = 0; row != 3; row = row + 1) {
      for (col_01 = 0; col_01 != 2; col_01 = col_01 + 1) {
        pdVar6 = TPZFMatrix<double>::operator()(&axes,row,col_01);
        dVar1 = *pdVar6;
        dVar2 = vft1.super_TPZVec<double>.fStore[col_01];
        pdVar6 = TPZFMatrix<double>::operator()(directions,row,col);
        *pdVar6 = dVar1 * dVar2 + *pdVar6;
        pdVar6 = TPZFMatrix<double>::operator()(&axes,row,col_01);
        dVar1 = *pdVar6;
        dVar2 = vft2.super_TPZVec<double>.fStore[col_01];
        pdVar6 = TPZFMatrix<double>::operator()(directions,row,col_00);
        *pdVar6 = dVar1 * dVar2 + *pdVar6;
      }
    }
    TPZFMatrix<double>::~TPZFMatrix(&axes);
  }
  TPZManVector<double,_2>::~TPZManVector(&vft2);
  TPZManVector<double,_2>::~TPZManVector(&vft1);
  TPZManVector<double,_5>::~TPZManVector(&faceOrient);
  TPZManVector<double,_9>::~TPZManVector(&edgeSign);
  TPZManVector<double,_3>::~TPZManVector(&v3);
  TPZManVector<double,_3>::~TPZManVector(&v2);
  TPZManVector<double,_3>::~TPZManVector(&v1);
  return;
}

Assistant:

void TPZPrism::ComputeHCurlDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions, const TPZVec<int> &transformationIds)
    {
        TPZManVector<TVar,3> v1(3),v2(3),v3(3);

        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
        }
        constexpr auto nEdges = 9;
        constexpr auto nFaces = 5;
        //edges                      6,  7    ,8,9,10,11,12,   13,  14
        constexpr REAL edgeLength[nEdges]{1,M_SQRT2,1,2, 2, 2, 1,M_SQRT2,1};
        //faces                    15,16,    17,   18,19
        constexpr REAL faceArea[nFaces]{0.5,2,2*M_SQRT2,2,0.5};
        TPZManVector<REAL,nEdges> edgeSign(nEdges,0);
        TPZManVector<REAL,nFaces>  faceOrient(nFaces,0);

        for(auto iEdge = 0; iEdge < nEdges; iEdge++){
            edgeSign[iEdge] = transformationIds[iEdge] == 0 ? 1 : -1;
        }
        for(auto iFace = 0; iFace < nFaces; iFace++){
            faceOrient[iFace] = transformationIds[nEdges + iFace] % 2 == 0 ? 1 : -1;
        }
        for (int i=0; i<3; i++) {
            //v^{e,a} constant vector fields associated with edge e and vertex a
            //they are defined in such a way that v^{e,a} is normal to the edge \hat{e}
            //adjacent to edge e by the vertex a. the tangential component is set to be 1 /edgeLength[e]

            directions(i, 0) = (v1[i]) * edgeSign[0] / edgeLength[0];//edge 6  vertex 0
            directions(i, 1) = (v1[i] + v2[i]) * edgeSign[0] / edgeLength[0];//edge 6 vertex 1
            directions(i, 2) = (v2[i] * M_SQRT2) * edgeSign[1] / edgeLength[1];//edge 7 vertex 1
            directions(i, 3) = (-v1[i] * M_SQRT2) * edgeSign[1] / edgeLength[1];//edge 7 vertex 2
            directions(i, 4) = (v1[i] + v2[i]) * -1 * edgeSign[2] / edgeLength[2]; //edge 8 vertex 2
            directions(i, 5) = (-v2[i]) * edgeSign[2] / edgeLength[2]; //edge 8 vertex 0

            directions(i, 6) = v3[i] * edgeSign[3] / edgeLength[3];//edge 9 vertex 0
            directions(i, 7) = v3[i] * edgeSign[3] / edgeLength[3];//edge 9 vertex 3
            directions(i, 8) = v3[i] * edgeSign[4] / edgeLength[4];//edge 10 vertex 1
            directions(i, 9) = v3[i] * edgeSign[4] / edgeLength[4];//edge 10 vertex 4
            directions(i, 10) = v3[i] * edgeSign[5] / edgeLength[5];//edge 11 vertex 2
            directions(i, 11) = v3[i] * edgeSign[5] / edgeLength[5];//edge 11 vertex 5

            directions(i, 12) = (v1[i]) * edgeSign[6] / edgeLength[6];//edge 12 vertex 3
            directions(i, 13) = (v1[i] + v2[i]) * edgeSign[6] / edgeLength[6];//edge 12 vertex 4
            directions(i, 14) = (v2[i] * M_SQRT2) * edgeSign[7] / edgeLength[7];//edge 13 vertex 4
            directions(i, 15) = (-v1[i] * M_SQRT2) * edgeSign[7] / edgeLength[7];//edge 13 vertex 5
            directions(i, 16) = (v1[i] + v2[i]) * -1 * edgeSign[8] / edgeLength[8];//edge 14 vertex 5
            directions(i, 17) = (-v2[i]) * edgeSign[8] / edgeLength[8];//edge 14 vertex 3

            //v^{e,T} constant vector fields associated with edge e and aligned with it
            directions(i, 18) = (v1[i]+0.5*v2[i]) * edgeSign[0] / edgeLength[0];//edge 6
            directions(i, 19) = ((v2[i] - v1[i]) * M_SQRT1_2) * edgeSign[1] / edgeLength[1];//edge 7
            directions(i, 20) = (-0.5*v1[i]-v2[i]) * edgeSign[2] / edgeLength[2];//edge 8

            directions(i, 21) = v3[i] * edgeSign[3] / edgeLength[3];//edge 9
            directions(i, 22) = v3[i] * edgeSign[4] / edgeLength[4];//edge 10
            directions(i, 23) = v3[i] * edgeSign[5] / edgeLength[5];//edge 11

            directions(i, 24) = (v1[i]+0.5*v2[i]) * edgeSign[6] / edgeLength[6];//edge 12
            directions(i, 25) = ((v2[i] - v1[i]) * M_SQRT1_2) * edgeSign[7] / edgeLength[7];//edge 13
            directions(i, 26) = (-0.5*v1[i]-v2[i]) * edgeSign[8] / edgeLength[8];//edge 14

            //v^{F,e} constant vector fields associated with face F and edge e
            //they are defined in such a way that v^{F,e} is normal to the face \hat{F}
            //adjacent to face F by edge e
            directions(i, 27) = faceOrient[0] * edgeSign[6 - NCornerNodes] * v2[i]  / faceArea[0];//face 15 edge 6
            directions(i, 28) = faceOrient[0] * edgeSign[7 - NCornerNodes] * -1 * (v1[i] + v2[i])  / faceArea[0];//face 15 edge 7
            directions(i, 29) = faceOrient[0] * edgeSign[8 - NCornerNodes] * v1[i]  / faceArea[0];//face 15 edge 8

            directions(i, 30) = faceOrient[1] * edgeSign[6 - NCornerNodes] *  0.5 * v3[i] / faceArea[1];//face 16 edge 6
            directions(i, 31) = faceOrient[1] * edgeSign[10 - NCornerNodes] *  -1 * (v1[i]+v2[i]) / faceArea[1];//face 16 edge 10
            directions(i, 32) = faceOrient[1] * edgeSign[12 - NCornerNodes] *  0.5 * v3[i] / faceArea[1];;//face 16 edge 12
            directions(i, 33) = faceOrient[1] * edgeSign[9 - NCornerNodes] *  -v1[i] / faceArea[1];//face 16 edge 9

            directions(i, 34) = faceOrient[2] * edgeSign[7 - NCornerNodes] *  M_SQRT1_2 * v3[i] / faceArea[2];//face 17 edge 7
            directions(i, 35) = faceOrient[2] * edgeSign[11 - NCornerNodes] *  M_SQRT2 * v1[i] / faceArea[2];//face 17 edge 11
            directions(i, 36) = faceOrient[2] * edgeSign[13 - NCornerNodes] *  M_SQRT1_2 * v3[i] / faceArea[2];//face 17 edge 13
            directions(i, 37) = faceOrient[2] * edgeSign[10 - NCornerNodes] *  -M_SQRT2 * v2[i] / faceArea[2];//face 17 edge 10

            directions(i, 38) = faceOrient[3] * edgeSign[8 - NCornerNodes] * -0.5 * v3[i] / faceArea[3];//face 18 edge 8
            directions(i, 39) = faceOrient[3] * edgeSign[11 - NCornerNodes] *  -1 * (v1[i] + v2[i]) / faceArea[3];//face 18 edge 11
            directions(i, 40) = faceOrient[3] * edgeSign[14 - NCornerNodes] * -0.5 * v3[i] / faceArea[3];//face 18 edge 14
            directions(i, 41) = faceOrient[3] * edgeSign[9 - NCornerNodes] * -v2[i] / faceArea[3];//face 18 edge 9

            directions(i, 42) = faceOrient[4] * edgeSign[12 - NCornerNodes] * v2[i]  / faceArea[4];//face 19 edge 12
            directions(i, 43) = faceOrient[4] * edgeSign[13 - NCornerNodes] * -1 * (v1[i] + v2[i] )  / faceArea[4];//face 19 edge 13
            directions(i, 44) = faceOrient[4] * edgeSign[14 - NCornerNodes] * v1[i]  / faceArea[4];//face 19 edge 14

            //v^{F,T} are calculated afterwards

            //v^{F,orth} vector associated with face F and normal to it
            directions(i, 55) = -v3[i];//face 15
            directions(i, 56) = -v2[i];//face 16
            directions(i, 57) = (v1[i] + v2[i]) * M_SQRT1_2;//face 17
            directions(i, 58) = -v1[i];//face 18
            directions(i, 59) = v3[i];//face 19

            //v^{K,3}
            directions(i, 60) = v1[i];
            directions(i, 61) = v2[i];
            directions(i, 62) = v3[i];
        }

        TPZManVector<REAL,2> vft1(2,0), vft2(2,0);
        constexpr auto firstVftVec = 45;
        //v^{F,T} orthonormal vectors associated with face F and tangent to it.
        for(auto iFace = 0; iFace < nFaces; iFace ++){
            switch(iFace){
                case 0:
                case 4:
                    TPZTriangle::ComputeHCurlFaceDirections(vft1,vft2,transformationIds[nEdges + iFace]);
                    break;
                case 1:
                case 2:
                case 3:
                    TPZQuadrilateral::ComputeHCurlFaceDirections(vft1,vft2,transformationIds[nEdges + iFace]);
                    break;
            }
            directions(0,firstVftVec+2*iFace) = 0;directions(1,firstVftVec+2*iFace) = 0;directions(2,firstVftVec+2*iFace) = 0;
            directions(0,firstVftVec+2*iFace+1) = 0;directions(1,firstVftVec+2*iFace+1) = 0;directions(2,firstVftVec+2*iFace+1) = 0;
            auto axes = TPZPrism::TransformElementToSide(NCornerNodes+nEdges+iFace).Mult();
            axes.Transpose();
            for(auto x = 0; x < Dimension; x++){
                for(auto i = 0; i < 2; i++) {
                    directions(x, firstVftVec + 2 * iFace) += axes(x,i) * vft1[i];
                    directions(x, firstVftVec + 2 * iFace + 1) += axes(x,i) * vft2[i];
                }
            }
        }
    }